

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O3

fdtd3D * init_fdtd_3D_cpml(fdtd3D *__return_storage_ptr__,float_type *domain_size,float_type Sc,
                          float_type smallest_wavelength,border_condition *borders,
                          uintmax_t cpml_thickness)

{
  undefined1 auVar1 [16];
  border_condition bVar2;
  border_condition bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  float_type fVar6;
  uintmax_t uVar7;
  void *pvVar8;
  float_type *pfVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar20 [16];
  double dVar14;
  undefined1 auVar21 [16];
  double dVar15;
  double __x;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar22 [16];
  double dVar19;
  undefined1 in_register_00001208 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  uintmax_t uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double local_a8;
  float_type cpml_width;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  auVar23._8_56_ = in_register_00001208;
  auVar23._0_8_ = Sc;
  dVar32 = smallest_wavelength / 20.0;
  auVar20 = auVar23._0_16_;
  dVar14 = (dVar32 * Sc) / 299792458.0;
  auVar30._8_8_ = dVar32;
  auVar30._0_8_ = dVar32;
  auVar30 = vdivpd_avx(*(undefined1 (*) [16])domain_size,auVar30);
  auVar30 = vroundpd_avx(auVar30,10);
  auVar13 = vcvttpd2uqq_avx512vl(auVar30);
  auVar21._0_8_ = domain_size[2] / dVar32;
  auVar21._8_8_ = 0;
  auVar21 = vroundsd_avx(auVar21,auVar21,10);
  uVar7 = vcvttsd2usi_avx512f(auVar21);
  if (0.5773502691896258 < Sc) {
    fprintf(_stderr,
            "The value of Sc is too high, the simulation may be unstable. Please use a value lesser or equal to %.5f\n"
            ,0x3fe279a74590331d);
  }
  lVar10 = vpextrq_avx(auVar13,1);
  uVar29 = auVar13._0_8_;
  __return_storage_ptr__->dx = dVar32;
  __return_storage_ptr__->dy = dVar32;
  __return_storage_ptr__->dz = dVar32;
  __return_storage_ptr__->dt = dVar14;
  lVar11 = lVar10 * uVar29;
  sVar12 = uVar7 * lVar11 * 8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->hx = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->hy = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->hz = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->ex = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->ey = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->ez = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->permittivity_inv = pvVar8;
  pvVar8 = calloc(1,sVar12);
  __return_storage_ptr__->permeability_inv = pvVar8;
  __return_storage_ptr__->psi_ey_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_ey_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_ey_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_ey_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_hx_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_hx_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_hx_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_hx_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_hy_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_hy_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_hy_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_hy_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_hz_x[0] = (void *)0x0;
  __return_storage_ptr__->psi_hz_x[1] = (void *)0x0;
  __return_storage_ptr__->psi_hz_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_hz_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_ex_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ex_y[1] = (void *)0x0;
  __return_storage_ptr__->psi_ex_z[0] = (void *)0x0;
  __return_storage_ptr__->psi_ex_z[1] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[0] = (void *)0x0;
  __return_storage_ptr__->psi_ez_y[1] = (void *)0x0;
  __return_storage_ptr__->bx = (float_type *)0x0;
  __return_storage_ptr__->by = (float_type *)0x0;
  __return_storage_ptr__->bz = (float_type *)0x0;
  __return_storage_ptr__->cx = (float_type *)0x0;
  __return_storage_ptr__->cy = (float_type *)0x0;
  __return_storage_ptr__->cz = (float_type *)0x0;
  __return_storage_ptr__->cpml_thickness = cpml_thickness;
  auVar1 = *(undefined1 (*) [16])borders;
  *(undefined1 (*) [16])__return_storage_ptr__->border_condition = auVar1;
  bVar2 = borders[4];
  __return_storage_ptr__->border_condition[4] = bVar2;
  bVar3 = borders[5];
  __return_storage_ptr__->border_condition[5] = bVar3;
  fVar6 = domain_size[1];
  __return_storage_ptr__->domain_size[0] = *domain_size;
  __return_storage_ptr__->domain_size[1] = fVar6;
  __return_storage_ptr__->domain_size[2] = domain_size[2];
  __return_storage_ptr__->sizeX = uVar29;
  __return_storage_ptr__->sizeY = auVar13._8_8_;
  __return_storage_ptr__->sizeZ = uVar7;
  __return_storage_ptr__->Sc = Sc;
  __return_storage_ptr__->num_Jsources = 0;
  __return_storage_ptr__->num_Msources = 0;
  __return_storage_ptr__->time = 0.0;
  __return_storage_ptr__->Jsources = (fdtd_source *)0x0;
  __return_storage_ptr__->JsourceLocations = (void *)0x0;
  __return_storage_ptr__->Msources = (fdtd_source *)0x0;
  __return_storage_ptr__->MsourceLocations = (void *)0x0;
  if (cpml_thickness != 0) {
    if ((auVar1 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      sVar12 = cpml_thickness * lVar11 * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hx_z[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hy_z[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ex_z[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ey_z[0] = pvVar8;
    }
    if ((auVar1 & (undefined1  [16])0x400000000) != (undefined1  [16])0x0) {
      sVar12 = lVar11 * cpml_thickness * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hx_z[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hy_z[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ex_z[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ey_z[1] = pvVar8;
    }
    if ((auVar1 & (undefined1  [16])0x400000000) != (undefined1  [16])0x0) {
      sVar12 = uVar7 * cpml_thickness * lVar10 * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hy_x[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hz_x[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ey_x[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ez_x[0] = pvVar8;
    }
    if ((auVar1 & (undefined1  [16])0x4) != (undefined1  [16])0x0) {
      sVar12 = uVar7 * cpml_thickness * lVar10 * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hy_x[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hz_x[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ey_x[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ez_x[1] = pvVar8;
    }
    if ((bVar3 & border_cpml) != 0) {
      sVar12 = uVar7 * cpml_thickness * uVar29 * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hx_y[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hz_y[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ex_y[0] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ez_y[0] = pvVar8;
    }
    if ((bVar2 & border_cpml) != 0) {
      sVar12 = uVar7 * cpml_thickness * uVar29 * 8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hx_y[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_hz_y[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ex_y[1] = pvVar8;
      pvVar8 = calloc(1,sVar12);
      __return_storage_ptr__->psi_ez_y[1] = pvVar8;
    }
  }
  auVar23 = ZEXT1664(auVar20);
  pfVar9 = (float_type *)calloc(cpml_thickness,8);
  __return_storage_ptr__->bx = pfVar9;
  __return_storage_ptr__->by = pfVar9;
  __return_storage_ptr__->bz = pfVar9;
  pfVar9 = (float_type *)calloc(cpml_thickness,8);
  __return_storage_ptr__->cx = pfVar9;
  __return_storage_ptr__->cy = pfVar9;
  __return_storage_ptr__->cz = pfVar9;
  if (cpml_thickness != 0) {
    lVar10 = 0;
    dVar4 = __return_storage_ptr__->dx * 5.563250280268093e-11 * 0.1;
    dVar15 = 4.0 / (__return_storage_ptr__->dx * 376.7303134617706);
    auVar13 = vcvtusi2sd_avx512f(auVar23._0_16_,cpml_thickness - 1);
    do {
      dVar18 = __return_storage_ptr__->dt;
      auVar20 = vcvtusi2sd_avx512f(auVar23._0_16_,lVar10);
      __x = auVar20._0_8_ / auVar13._0_8_;
      dVar16 = pow(__x,4.0);
      auVar24._0_8_ = pow(__x,4.0);
      auVar24._8_56_ = extraout_var;
      auVar20 = vfmadd213sd_fma(auVar24._0_16_,ZEXT816(0) << 0x40,ZEXT816(0x3ff0000000000000));
      dVar19 = 1.0 - __x;
      dVar17 = pow(dVar19,4.0);
      dVar18 = exp(((dVar17 * dVar4) / 8.85418781762039e-12 +
                   (dVar16 * dVar15) / (auVar20._0_8_ * 8.85418781762039e-12)) * -dVar18);
      __return_storage_ptr__->bx[cpml_thickness - 1] = dVar18;
      local_a8 = __return_storage_ptr__->dt;
      dVar18 = pow(__x,4.0);
      dVar16 = pow(__x,4.0);
      auVar25._0_8_ = pow(__x,4.0);
      auVar25._8_56_ = extraout_var_00;
      auVar20 = vfmadd132sd_fma(auVar25._0_16_,ZEXT816(0x3ff0000000000000),ZEXT816(0));
      auVar31._0_8_ = auVar20._0_8_;
      auVar26._0_8_ = pow(__x,4.0);
      auVar26._8_56_ = extraout_var_01;
      auVar1 = vfmadd132sd_fma(auVar26._0_16_,ZEXT816(0x3ff0000000000000),ZEXT816(0));
      auVar27._0_8_ = pow(__x,4.0);
      auVar27._8_56_ = extraout_var_02;
      auVar5 = vfmadd132sd_fma(auVar27._0_16_,ZEXT816(0x3ff0000000000000),ZEXT816(0));
      dVar17 = pow(dVar19,4.0);
      auVar31._8_8_ = 0;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar16 * dVar15;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar17 * dVar4 * auVar5._0_8_ * auVar1._0_8_;
      auVar1 = vfmadd231sd_fma(auVar22,auVar31,auVar20);
      local_a8 = -local_a8;
      dVar16 = pow(__x,4.0);
      auVar28._0_8_ = pow(__x,4.0);
      auVar28._8_56_ = extraout_var_03;
      auVar20 = vfmadd132sd_fma(auVar28._0_16_,ZEXT816(0x3ff0000000000000),ZEXT816(0));
      dVar19 = pow(dVar19,4.0);
      dVar19 = exp(((dVar19 * dVar4) / 8.85418781762039e-12 +
                   (dVar16 * dVar15) / (auVar20._0_8_ * 8.85418781762039e-12)) * local_a8);
      lVar10 = lVar10 + 1;
      __return_storage_ptr__->cx[cpml_thickness - 1] =
           (dVar19 + -1.0) * ((dVar18 * dVar15) / auVar1._0_8_);
      cpml_thickness = cpml_thickness - 1;
    } while (cpml_thickness != 0);
  }
  auVar13 = vshufpd_avx(auVar30,auVar30,1);
  fprintf(_stderr,"Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n",dVar14,dVar32,dVar32,dVar32,
          auVar30._0_8_,auVar13._0_8_,auVar21._0_8_);
  return __return_storage_ptr__;
}

Assistant:

struct fdtd3D init_fdtd_3D_cpml(float_type domain_size[3], float_type Sc,
                                float_type smallest_wavelength,
                                enum border_condition borders[num_borders_3D],
                                uintmax_t cpml_thickness) {

  float_type dx = smallest_wavelength / float_cst(20.);
  float_type dy = dx;
  float_type dz = dx;
  float_type dt = dx * Sc / c_light;
  float_type sizeXf = ceil(domain_size[0] / dx);
  float_type sizeYf = ceil(domain_size[1] / dy);
  float_type sizeZf = ceil(domain_size[2] / dy);
  uintmax_t sizeX = (uintmax_t)sizeXf;
  uintmax_t sizeY = (uintmax_t)sizeYf;
  uintmax_t sizeZ = (uintmax_t)sizeZf;
  float_type Sc_max = float_cst(1.) / sqrt(float_cst(3.));
  if (Sc > Sc_max)
    fprintf(stderr,
            "The value of Sc is too high, the simulation may be unstable. "
            "Please use a value lesser or equal to %.5f\n",
            Sc_max);

  struct fdtd3D fdtd = {
      .dx = dx,
      .dy = dy,
      .dz = dz,
      .dt = dt,
      .hx = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hy = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .hz = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ex = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ey = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .ez = calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permittivity_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .permeability_inv =
          calloc(1, VLA_3D_size(float_type, sizeX, sizeY, sizeZ)),
      .psi_hx_y = {NULL, NULL},
      .psi_hx_z = {NULL, NULL},
      .psi_hy_x = {NULL, NULL},
      .psi_hy_z = {NULL, NULL},
      .psi_hz_x = {NULL, NULL},
      .psi_hz_y = {NULL, NULL},
      .psi_ex_y = {NULL, NULL},
      .psi_ex_z = {NULL, NULL},
      .psi_ey_x = {NULL, NULL},
      .psi_ey_z = {NULL, NULL},
      .psi_ez_x = {NULL, NULL},
      .psi_ez_y = {NULL, NULL},
      .bx = NULL,
      .by = NULL,
      .bz = NULL,
      .cx = NULL,
      .cy = NULL,
      .cz = NULL,
      .cpml_thickness = cpml_thickness,
      .border_condition =
          {
              [border_front] = borders[border_front],
              [border_back] = borders[border_back],
              [border_top] = borders[border_top],
              [border_bottom] = borders[border_bottom],
              [border_right] = borders[border_right],
              [border_left] = borders[border_left],
          },
      .domain_size = {domain_size[0], domain_size[1], domain_size[2]},
      .sizeX = sizeX,
      .sizeY = sizeY,
      .sizeZ = sizeZ,
      .Sc = Sc,
      .num_Jsources = 0,
      .Jsources = NULL,
      .JsourceLocations = NULL,
      .num_Msources = 0,
      .Msources = NULL,
      .MsourceLocations = NULL,
      .time = float_cst(0.),
  };

  if (cpml_thickness > 0 && fdtd.border_condition[border_front] & border_cpml) {
    fdtd.psi_hx_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_back] & border_cpml) {
    fdtd.psi_hx_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_hy_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ex_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
    fdtd.psi_ey_z[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, sizeY, cpml_thickness));
  }
  if (cpml_thickness > 0 &&
      fdtd.border_condition[border_bottom] & border_cpml) {
    fdtd.psi_hy_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[0] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_top] & border_cpml) {
    fdtd.psi_hy_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_hz_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ey_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
    fdtd.psi_ez_x[1] =
        calloc(1, VLA_3D_size(float_type, cpml_thickness, sizeY, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_left] & border_cpml) {
    fdtd.psi_hx_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[0] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  if (cpml_thickness > 0 && fdtd.border_condition[border_right] & border_cpml) {
    fdtd.psi_hx_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_hz_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ex_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
    fdtd.psi_ez_y[1] =
        calloc(1, VLA_3D_size(float_type, sizeX, cpml_thickness, sizeZ));
  }
  fdtd.bx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.by = fdtd.bx;
  fdtd.bz = fdtd.bx;
  fdtd.cx = calloc(cpml_thickness, sizeof(*fdtd.bx));
  fdtd.cy = fdtd.cx;
  fdtd.cz = fdtd.cx;
  float_type alpha_max = float_cst(2.) * M_PI * eps0 * fdtd.dx * float_cst(0.1);
  float_type sigma_max = float_cst(0.8) * (polynomial_taper_order + 1) /
                         (fdtd.dx * sqrt(mu0 / eps0));
  for (uintmax_t d = 0; d < cpml_thickness; ++d) {
    // store from border of domain to interface CPML / simulation medium
    fdtd.bx[cpml_thickness - d - 1] =
        b(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
    fdtd.cx[cpml_thickness - d - 1] =
        c(d, cpml_thickness - 1, fdtd.dt, alpha_max, sigma_max);
  }

  fprintf(stderr, "Dt %e Dx %e Dy %e Dz %e (%.0fx%.0fx%.0f)\n", dt, dx, dy, dz,
          sizeXf, sizeYf, sizeZf);

  return fdtd;
}